

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzinterpolationspace.cpp
# Opt level: O2

void __thiscall TPZInterpolationSpace::ShortPrint(TPZInterpolationSpace *this,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,
                           "virtual void TPZInterpolationSpace::ShortPrint(std::ostream &) const");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"PreferredSideOrder ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->fPreferredOrder);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void TPZInterpolationSpace::ShortPrint(std::ostream &out) const {
    out << __PRETTY_FUNCTION__ << std::endl;
    out << "PreferredSideOrder " << fPreferredOrder << std::endl;
}